

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void arm::display_op(OpCode op,ostream *o)

{
  char *pcVar1;
  ostream *this;
  
  switch(op) {
  case Nop:
    pcVar1 = "nop";
    break;
  case B:
    pcVar1 = "b";
    break;
  case Bl:
    pcVar1 = "bl";
    break;
  case Bx:
    pcVar1 = "bx";
    break;
  case Cbz:
    pcVar1 = "cbz";
    break;
  case Cbnz:
    pcVar1 = "cbnz";
    break;
  case Mov:
    pcVar1 = "mov";
    break;
  case MovT:
    pcVar1 = "movt";
    break;
  case Mvn:
    pcVar1 = "mvn";
    break;
  case Add:
    pcVar1 = "add";
    break;
  case Sub:
    pcVar1 = "sub";
    break;
  case Rsb:
    pcVar1 = "rsb";
    break;
  case Mul:
    pcVar1 = "mul";
    break;
  case SMMul:
    pcVar1 = "smmul";
    break;
  case Mla:
    pcVar1 = "mla";
    break;
  case SMMla:
    pcVar1 = "smmla";
    break;
  case SDiv:
    pcVar1 = "sdiv";
    break;
  case And:
    pcVar1 = "and";
    break;
  case Orr:
    pcVar1 = "orr";
    break;
  case Eor:
    pcVar1 = "eor";
    break;
  case Bic:
    pcVar1 = "bic";
    break;
  case Lsl:
    pcVar1 = "lsl";
    break;
  case Lsr:
    pcVar1 = "lsr";
    break;
  case Asr:
    pcVar1 = "asr";
    break;
  case Cmp:
    pcVar1 = "cmp";
    break;
  case Cmn:
    pcVar1 = "cmn";
    break;
  case LdR:
    pcVar1 = "ldr";
    break;
  case LdM:
    pcVar1 = "ldm";
    break;
  case StR:
    pcVar1 = "str";
    break;
  case StM:
    pcVar1 = "stm";
    break;
  case Push:
    pcVar1 = "push";
    break;
  case Pop:
    pcVar1 = "pop";
    break;
  case _Label:
    return;
  default:
    this = std::operator<<(o,"?");
    std::ostream::operator<<(this,op);
    return;
  case _Mod:
    pcVar1 = "_MOD";
  }
  std::operator<<(o,pcVar1);
  return;
}

Assistant:

void display_op(OpCode op, std::ostream &o) {
  switch (op) {
    case OpCode::Nop:
      o << "nop";
      break;
    case OpCode::B:
      o << "b";
      break;
    case OpCode::Bl:
      o << "bl";
      break;
    case OpCode::Bx:
      o << "bx";
      break;
    case OpCode::Cbz:
      o << "cbz";
      break;
    case OpCode::Cbnz:
      o << "cbnz";
      break;
    case OpCode::Mov:
      o << "mov";
      break;
    case OpCode::MovT:
      o << "movt";
      break;
    case OpCode::Mvn:
      o << "mvn";
      break;
    case OpCode::Add:
      o << "add";
      break;
    case OpCode::Sub:
      o << "sub";
      break;
    case OpCode::Rsb:
      o << "rsb";
      break;
    case OpCode::Mul:
      o << "mul";
      break;
    case OpCode::SMMul:
      o << "smmul";
      break;
    case OpCode::Mla:
      o << "mla";
      break;
    case OpCode::SMMla:
      o << "smmla";
      break;
    case OpCode::SDiv:
      o << "sdiv";
      break;
    case OpCode::Lsl:
      o << "lsl";
      break;
    case OpCode::Lsr:
      o << "lsr";
      break;
    case OpCode::Asr:
      o << "asr";
      break;
    case OpCode::And:
      o << "and";
      break;
    case OpCode::Orr:
      o << "orr";
      break;
    case OpCode::Eor:
      o << "eor";
      break;
    case OpCode::Bic:
      o << "bic";
      break;
    case OpCode::Cmp:
      o << "cmp";
      break;
    case OpCode::Cmn:
      o << "cmn";
      break;
    case OpCode::LdR:
      o << "ldr";
      break;
    case OpCode::LdM:
      o << "ldm";
      break;
    case OpCode::StR:
      o << "str";
      break;
    case OpCode::StM:
      o << "stm";
      break;
    case OpCode::Push:
      o << "push";
      break;
    case OpCode::Pop:
      o << "pop";
      break;
    case OpCode::_Label:
      // Labels are pseudo-instructions
      break;
    case OpCode::_Mod:
      o << "_MOD";
      break;
    default:
      o << "?" << (int)op;
      break;
  }
}